

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

token_type __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::lexer::scan(lexer *this)

{
  byte bVar1;
  lexer_char_t *plVar2;
  bool bVar3;
  lexer_char_t *plVar4;
  byte local_11;
  uint yyaccept;
  lexer_char_t yych;
  lexer *this_local;
  
  while( true ) {
    this->m_marker = (lexer_char_t *)0x0;
    this->m_start = this->m_cursor;
    if (this->m_start == (lexer_char_t *)0x0) {
      __assert_fail("m_start != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/NikitaEvs[P]WildHack/thirdparty/json/json.hpp"
                    ,0x25b7,
                    "token_type nlohmann::basic_json<>::lexer::scan() [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                   );
    }
    if ((long)this->m_limit - (long)this->m_cursor < 5) {
      fill_line_buffer(this,5);
    }
    bVar1 = *this->m_cursor;
    if ((""[(int)(uint)bVar1] & 0x20) == 0) break;
    do {
      this->m_cursor = this->m_cursor + 1;
      if (this->m_limit <= this->m_cursor) {
        fill_line_buffer(this,1);
      }
    } while ((""[(int)(uint)*this->m_cursor] & 0x20) != 0);
  }
  if (bVar1 < 0x5c) {
    if (bVar1 < 0x2e) {
      if (bVar1 < 0x23) {
        if (bVar1 == 0) {
          this->m_cursor = this->m_cursor + 1;
          this->last_token_type = end_of_input;
          goto LAB_0018db15;
        }
        if (bVar1 < 0x22) goto LAB_0018cd88;
        bVar3 = false;
        plVar2 = this->m_cursor;
        plVar4 = plVar2 + 1;
        this->m_cursor = plVar4;
        this->m_marker = plVar4;
        local_11 = plVar2[1];
        if ((0x1f < local_11) && ((local_11 < 0x80 || ((0xc1 < local_11 && (local_11 < 0xf5)))))) {
LAB_0018d13a:
          if ((""[(int)(uint)local_11] & 0x80) == 0) {
            if (local_11 < 0xe1) {
              if (local_11 < 0x5d) {
                if (local_11 < 0x20) goto LAB_0018d208;
                if (local_11 < 0x23) {
                  this->m_cursor = this->m_cursor + 1;
                  this->last_token_type = value_string;
                  goto LAB_0018db15;
                }
                this->m_cursor = this->m_cursor + 1;
                if (this->m_limit <= this->m_cursor) {
                  fill_line_buffer(this,1);
                }
                bVar1 = *this->m_cursor;
                if (bVar1 < 0x66) {
                  if (bVar1 < 0x30) {
                    if ((bVar1 != 0x22) && (bVar1 < 0x2f)) goto LAB_0018d208;
                  }
                  else {
                    if (bVar1 < 0x5d) {
                      if (0x5b < bVar1) goto LAB_0018d105;
                      goto LAB_0018d208;
                    }
                    if (bVar1 != 0x62) goto LAB_0018d208;
                  }
                }
                else if (bVar1 < 0x72) {
                  if ((0x66 < bVar1) && (bVar1 != 0x6e)) goto LAB_0018d208;
                }
                else if (bVar1 < 0x74) {
                  if (0x72 < bVar1) goto LAB_0018d208;
                }
                else if (0x74 < bVar1) {
                  if (0x75 < bVar1) goto LAB_0018d208;
                  this->m_cursor = this->m_cursor + 1;
                  if (this->m_limit <= this->m_cursor) {
                    fill_line_buffer(this,1);
                  }
                  bVar1 = *this->m_cursor;
                  if (bVar1 < 0x41) {
                    if ((bVar1 < 0x30) || (0x39 < bVar1)) goto LAB_0018d208;
                  }
                  else if ((0x46 < bVar1) && ((bVar1 < 0x61 || (0x66 < bVar1)))) goto LAB_0018d208;
                  this->m_cursor = this->m_cursor + 1;
                  if (this->m_limit <= this->m_cursor) {
                    fill_line_buffer(this,1);
                  }
                  bVar1 = *this->m_cursor;
                  if (bVar1 < 0x41) {
                    if ((bVar1 < 0x30) || (0x39 < bVar1)) goto LAB_0018d208;
                  }
                  else if ((0x46 < bVar1) && ((bVar1 < 0x61 || (0x66 < bVar1)))) goto LAB_0018d208;
                  this->m_cursor = this->m_cursor + 1;
                  if (this->m_limit <= this->m_cursor) {
                    fill_line_buffer(this,1);
                  }
                  bVar1 = *this->m_cursor;
                  if (bVar1 < 0x41) {
                    if ((bVar1 < 0x30) || (0x39 < bVar1)) goto LAB_0018d208;
                  }
                  else if ((0x46 < bVar1) && ((bVar1 < 0x61 || (0x66 < bVar1)))) goto LAB_0018d208;
                  this->m_cursor = this->m_cursor + 1;
                  if (this->m_limit <= this->m_cursor) {
                    fill_line_buffer(this,1);
                  }
                  bVar1 = *this->m_cursor;
                  if (bVar1 < 0x41) {
                    if ((bVar1 < 0x30) || (0x39 < bVar1)) goto LAB_0018d208;
                  }
                  else if ((0x46 < bVar1) && ((bVar1 < 0x61 || (0x66 < bVar1)))) goto LAB_0018d208;
                }
                goto LAB_0018d105;
              }
              if (local_11 < 0xc2) goto LAB_0018d208;
              if (0xdf < local_11) {
                this->m_cursor = this->m_cursor + 1;
                if (this->m_limit <= this->m_cursor) {
                  fill_line_buffer(this,1);
                }
                bVar1 = *this->m_cursor;
                if (0x9f < bVar1) goto joined_r0x0018d43c;
                goto LAB_0018d208;
              }
            }
            else {
              if (local_11 < 0xf0) {
                if (local_11 == 0xed) {
                  this->m_cursor = this->m_cursor + 1;
                  if (this->m_limit <= this->m_cursor) {
                    fill_line_buffer(this,1);
                  }
                  if ((0x7f < *this->m_cursor) && (*this->m_cursor < 0xa0)) goto LAB_0018d33e;
                  goto LAB_0018d208;
                }
              }
              else {
                if (local_11 < 0xf1) {
                  this->m_cursor = this->m_cursor + 1;
                  if (this->m_limit <= this->m_cursor) {
                    fill_line_buffer(this,1);
                  }
                  bVar1 = *this->m_cursor;
                  if (bVar1 < 0x90) goto LAB_0018d208;
                }
                else {
                  if (0xf3 < local_11) {
                    if (local_11 < 0xf5) {
                      this->m_cursor = this->m_cursor + 1;
                      if (this->m_limit <= this->m_cursor) {
                        fill_line_buffer(this,1);
                      }
                      if ((0x7f < *this->m_cursor) && (*this->m_cursor < 0x90)) goto LAB_0018d3f0;
                    }
                    goto LAB_0018d208;
                  }
                  this->m_cursor = this->m_cursor + 1;
                  if (this->m_limit <= this->m_cursor) {
                    fill_line_buffer(this,1);
                  }
                  bVar1 = *this->m_cursor;
                  if (bVar1 < 0x80) goto LAB_0018d208;
                }
                if (0xbf < bVar1) goto LAB_0018d208;
              }
LAB_0018d3f0:
              this->m_cursor = this->m_cursor + 1;
              if (this->m_limit <= this->m_cursor) {
                fill_line_buffer(this,1);
              }
              bVar1 = *this->m_cursor;
              if (bVar1 < 0x80) goto LAB_0018d208;
joined_r0x0018d43c:
              if (0xbf < bVar1) goto LAB_0018d208;
            }
LAB_0018d33e:
            this->m_cursor = this->m_cursor + 1;
            if (this->m_limit <= this->m_cursor) {
              fill_line_buffer(this,1);
            }
            if ((*this->m_cursor < 0x80) || (0xbf < *this->m_cursor)) goto LAB_0018d208;
          }
LAB_0018d105:
          this->m_cursor = this->m_cursor + 1;
          if (this->m_limit <= this->m_cursor) {
            fill_line_buffer(this,1);
          }
          local_11 = *this->m_cursor;
          goto LAB_0018d13a;
        }
      }
      else {
        if (bVar1 < 0x2c) goto LAB_0018cd88;
        if (bVar1 < 0x2d) {
          this->m_cursor = this->m_cursor + 1;
          this->last_token_type = value_separator;
          goto LAB_0018db15;
        }
        plVar2 = this->m_cursor;
        this->m_cursor = plVar2 + 1;
        bVar1 = plVar2[1];
        if (0x2f < bVar1) {
          if (bVar1 < 0x31) goto LAB_0018cec4;
          if (bVar1 < 0x3a) goto LAB_0018cf31;
        }
      }
      goto LAB_0018cd98;
    }
    if (bVar1 < 0x3a) {
      if (0x2f < bVar1) {
        if (bVar1 < 0x31) {
LAB_0018cec4:
          plVar2 = this->m_cursor;
          plVar4 = plVar2 + 1;
          this->m_cursor = plVar4;
          this->m_marker = plVar4;
          bVar1 = plVar2[1];
          if (bVar1 < 0x45) {
joined_r0x0018cef8:
            if (bVar1 == 0x2e) {
              bVar3 = true;
              plVar2 = this->m_cursor;
              this->m_cursor = plVar2 + 1;
              bVar1 = plVar2[1];
              if ((bVar1 < 0x30) || (0x39 < bVar1)) goto LAB_0018d208;
              do {
                plVar2 = this->m_cursor;
                this->m_cursor = plVar2 + 1;
                this->m_marker = plVar2 + 1;
                if ((long)this->m_limit - (long)this->m_cursor < 3) {
                  fill_line_buffer(this,3);
                }
                bVar1 = *this->m_cursor;
                if (0x44 < bVar1) goto joined_r0x0018cfba;
              } while ((0x2f < bVar1) && (bVar1 < 0x3a));
            }
          }
          else if ((bVar1 < 0x46) || (bVar1 == 0x65)) goto LAB_0018d5e4;
        }
        else {
LAB_0018cf31:
          do {
            plVar2 = this->m_cursor;
            this->m_cursor = plVar2 + 1;
            this->m_marker = plVar2 + 1;
            if ((long)this->m_limit - (long)this->m_cursor < 3) {
              fill_line_buffer(this,3);
            }
            bVar1 = *this->m_cursor;
          } while ((""[(int)(uint)bVar1] & 0x40) != 0);
          if (bVar1 < 0x45) goto joined_r0x0018cef8;
joined_r0x0018cfba:
          if ((0x45 < bVar1) && (bVar1 != 0x65)) goto LAB_0018cf21;
LAB_0018d5e4:
          bVar3 = true;
          plVar2 = this->m_cursor;
          this->m_cursor = plVar2 + 1;
          bVar1 = plVar2[1];
          if (bVar1 < 0x2d) {
            if (bVar1 != 0x2b) goto LAB_0018d208;
LAB_0018d7e9:
            plVar2 = this->m_cursor;
            this->m_cursor = plVar2 + 1;
            bVar1 = plVar2[1];
          }
          else if (bVar1 < 0x2e) goto LAB_0018d7e9;
          if ((bVar1 < 0x30) || (0x39 < bVar1)) goto LAB_0018d208;
          do {
            this->m_cursor = this->m_cursor + 1;
            if (this->m_limit <= this->m_cursor) {
              fill_line_buffer(this,1);
            }
          } while ((0x2f < *this->m_cursor) && (*this->m_cursor < 0x3a));
        }
LAB_0018cf21:
        this->last_token_type = value_number;
        goto LAB_0018db15;
      }
    }
    else {
      if (bVar1 < 0x3b) {
        this->m_cursor = this->m_cursor + 1;
        this->last_token_type = name_separator;
        goto LAB_0018db15;
      }
      if (0x5a < bVar1) {
        this->m_cursor = this->m_cursor + 1;
        this->last_token_type = begin_array;
        goto LAB_0018db15;
      }
    }
LAB_0018cd88:
    this->m_cursor = this->m_cursor + 1;
  }
  else {
    if (0x6e < bVar1) {
      if (bVar1 < 0x7b) {
        if (bVar1 == 0x74) {
          bVar3 = false;
          plVar2 = this->m_cursor;
          plVar4 = plVar2 + 1;
          this->m_cursor = plVar4;
          this->m_marker = plVar4;
          if (plVar2[1] == 'r') {
            plVar2 = this->m_cursor;
            this->m_cursor = plVar2 + 1;
            if ((plVar2[1] == 'u') &&
               (plVar2 = this->m_cursor, this->m_cursor = plVar2 + 1, plVar2[1] == 'e')) {
              this->m_cursor = this->m_cursor + 1;
              this->last_token_type = literal_true;
              goto LAB_0018db15;
            }
            goto LAB_0018d208;
          }
          goto LAB_0018cd98;
        }
      }
      else {
        if (bVar1 < 0x7c) {
          this->m_cursor = this->m_cursor + 1;
          this->last_token_type = begin_object;
          goto LAB_0018db15;
        }
        if (bVar1 == 0x7d) {
          this->m_cursor = this->m_cursor + 1;
          this->last_token_type = end_object;
          goto LAB_0018db15;
        }
      }
      goto LAB_0018cd88;
    }
    if (bVar1 < 0x66) {
      if (bVar1 == 0x5d) {
        this->m_cursor = this->m_cursor + 1;
        this->last_token_type = end_array;
        goto LAB_0018db15;
      }
      goto LAB_0018cd88;
    }
    if (bVar1 < 0x67) {
      bVar3 = false;
      plVar2 = this->m_cursor;
      plVar4 = plVar2 + 1;
      this->m_cursor = plVar4;
      this->m_marker = plVar4;
      if (plVar2[1] == 'a') {
        plVar2 = this->m_cursor;
        this->m_cursor = plVar2 + 1;
        if (((plVar2[1] == 'l') &&
            (plVar2 = this->m_cursor, this->m_cursor = plVar2 + 1, plVar2[1] == 's')) &&
           (plVar2 = this->m_cursor, this->m_cursor = plVar2 + 1, plVar2[1] == 'e')) {
          this->m_cursor = this->m_cursor + 1;
          this->last_token_type = literal_false;
          goto LAB_0018db15;
        }
LAB_0018d208:
        this->m_cursor = this->m_marker;
        if (bVar3) goto LAB_0018cf21;
      }
    }
    else {
      if (bVar1 < 0x6e) goto LAB_0018cd88;
      bVar3 = false;
      plVar2 = this->m_cursor;
      plVar4 = plVar2 + 1;
      this->m_cursor = plVar4;
      this->m_marker = plVar4;
      if (plVar2[1] == 'u') {
        plVar2 = this->m_cursor;
        this->m_cursor = plVar2 + 1;
        if ((plVar2[1] == 'l') &&
           (plVar2 = this->m_cursor, this->m_cursor = plVar2 + 1, plVar2[1] == 'l')) {
          this->m_cursor = this->m_cursor + 1;
          this->last_token_type = literal_null;
          goto LAB_0018db15;
        }
        goto LAB_0018d208;
      }
    }
  }
LAB_0018cd98:
  this->last_token_type = parse_error;
LAB_0018db15:
  return this->last_token_type;
}

Assistant:

token_type scan()
        {
            while (true)
            {
                // pointer for backtracking information
                m_marker = nullptr;

                // remember the begin of the token
                m_start = m_cursor;
                assert(m_start != nullptr);


                {
                    lexer_char_t yych;
                    unsigned int yyaccept = 0;
                    static const unsigned char yybm[] =
                    {
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,  32,  32,   0,   0,  32,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        160, 128,   0, 128, 128, 128, 128, 128,
                        128, 128, 128, 128, 128, 128, 128, 128,
                        192, 192, 192, 192, 192, 192, 192, 192,
                        192, 192, 128, 128, 128, 128, 128, 128,
                        128, 128, 128, 128, 128, 128, 128, 128,
                        128, 128, 128, 128, 128, 128, 128, 128,
                        128, 128, 128, 128, 128, 128, 128, 128,
                        128, 128, 128, 128,   0, 128, 128, 128,
                        128, 128, 128, 128, 128, 128, 128, 128,
                        128, 128, 128, 128, 128, 128, 128, 128,
                        128, 128, 128, 128, 128, 128, 128, 128,
                        128, 128, 128, 128, 128, 128, 128, 128,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                    };
                    if ((m_limit - m_cursor) < 5)
                    {
                        fill_line_buffer(5);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yybm[0 + yych] & 32)
                    {
                        goto basic_json_parser_6;
                    }
                    if (yych <= '[')
                    {
                        if (yych <= '-')
                        {
                            if (yych <= '"')
                            {
                                if (yych <= 0x00)
                                {
                                    goto basic_json_parser_2;
                                }
                                if (yych <= '!')
                                {
                                    goto basic_json_parser_4;
                                }
                                goto basic_json_parser_9;
                            }
                            else
                            {
                                if (yych <= '+')
                                {
                                    goto basic_json_parser_4;
                                }
                                if (yych <= ',')
                                {
                                    goto basic_json_parser_10;
                                }
                                goto basic_json_parser_12;
                            }
                        }
                        else
                        {
                            if (yych <= '9')
                            {
                                if (yych <= '/')
                                {
                                    goto basic_json_parser_4;
                                }
                                if (yych <= '0')
                                {
                                    goto basic_json_parser_13;
                                }
                                goto basic_json_parser_15;
                            }
                            else
                            {
                                if (yych <= ':')
                                {
                                    goto basic_json_parser_17;
                                }
                                if (yych <= 'Z')
                                {
                                    goto basic_json_parser_4;
                                }
                                goto basic_json_parser_19;
                            }
                        }
                    }
                    else
                    {
                        if (yych <= 'n')
                        {
                            if (yych <= 'e')
                            {
                                if (yych == ']')
                                {
                                    goto basic_json_parser_21;
                                }
                                goto basic_json_parser_4;
                            }
                            else
                            {
                                if (yych <= 'f')
                                {
                                    goto basic_json_parser_23;
                                }
                                if (yych <= 'm')
                                {
                                    goto basic_json_parser_4;
                                }
                                goto basic_json_parser_24;
                            }
                        }
                        else
                        {
                            if (yych <= 'z')
                            {
                                if (yych == 't')
                                {
                                    goto basic_json_parser_25;
                                }
                                goto basic_json_parser_4;
                            }
                            else
                            {
                                if (yych <= '{')
                                {
                                    goto basic_json_parser_26;
                                }
                                if (yych == '}')
                                {
                                    goto basic_json_parser_28;
                                }
                                goto basic_json_parser_4;
                            }
                        }
                    }
basic_json_parser_2:
                    ++m_cursor;
                    {
                        last_token_type = token_type::end_of_input;
                        break;
                    }
basic_json_parser_4:
                    ++m_cursor;
basic_json_parser_5:
                    {
                        last_token_type = token_type::parse_error;
                        break;
                    }
basic_json_parser_6:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yybm[0 + yych] & 32)
                    {
                        goto basic_json_parser_6;
                    }
                    {
                        continue;
                    }
basic_json_parser_9:
                    yyaccept = 0;
                    yych = *(m_marker = ++m_cursor);
                    if (yych <= 0x1F)
                    {
                        goto basic_json_parser_5;
                    }
                    if (yych <= 0x7F)
                    {
                        goto basic_json_parser_31;
                    }
                    if (yych <= 0xC1)
                    {
                        goto basic_json_parser_5;
                    }
                    if (yych <= 0xF4)
                    {
                        goto basic_json_parser_31;
                    }
                    goto basic_json_parser_5;
basic_json_parser_10:
                    ++m_cursor;
                    {
                        last_token_type = token_type::value_separator;
                        break;
                    }
basic_json_parser_12:
                    yych = *++m_cursor;
                    if (yych <= '/')
                    {
                        goto basic_json_parser_5;
                    }
                    if (yych <= '0')
                    {
                        goto basic_json_parser_13;
                    }
                    if (yych <= '9')
                    {
                        goto basic_json_parser_15;
                    }
                    goto basic_json_parser_5;
basic_json_parser_13:
                    yyaccept = 1;
                    yych = *(m_marker = ++m_cursor);
                    if (yych <= 'D')
                    {
                        if (yych == '.')
                        {
                            goto basic_json_parser_43;
                        }
                    }
                    else
                    {
                        if (yych <= 'E')
                        {
                            goto basic_json_parser_44;
                        }
                        if (yych == 'e')
                        {
                            goto basic_json_parser_44;
                        }
                    }
basic_json_parser_14:
                    {
                        last_token_type = token_type::value_number;
                        break;
                    }
basic_json_parser_15:
                    yyaccept = 1;
                    m_marker = ++m_cursor;
                    if ((m_limit - m_cursor) < 3)
                    {
                        fill_line_buffer(3);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yybm[0 + yych] & 64)
                    {
                        goto basic_json_parser_15;
                    }
                    if (yych <= 'D')
                    {
                        if (yych == '.')
                        {
                            goto basic_json_parser_43;
                        }
                        goto basic_json_parser_14;
                    }
                    else
                    {
                        if (yych <= 'E')
                        {
                            goto basic_json_parser_44;
                        }
                        if (yych == 'e')
                        {
                            goto basic_json_parser_44;
                        }
                        goto basic_json_parser_14;
                    }
basic_json_parser_17:
                    ++m_cursor;
                    {
                        last_token_type = token_type::name_separator;
                        break;
                    }
basic_json_parser_19:
                    ++m_cursor;
                    {
                        last_token_type = token_type::begin_array;
                        break;
                    }
basic_json_parser_21:
                    ++m_cursor;
                    {
                        last_token_type = token_type::end_array;
                        break;
                    }
basic_json_parser_23:
                    yyaccept = 0;
                    yych = *(m_marker = ++m_cursor);
                    if (yych == 'a')
                    {
                        goto basic_json_parser_45;
                    }
                    goto basic_json_parser_5;
basic_json_parser_24:
                    yyaccept = 0;
                    yych = *(m_marker = ++m_cursor);
                    if (yych == 'u')
                    {
                        goto basic_json_parser_46;
                    }
                    goto basic_json_parser_5;
basic_json_parser_25:
                    yyaccept = 0;
                    yych = *(m_marker = ++m_cursor);
                    if (yych == 'r')
                    {
                        goto basic_json_parser_47;
                    }
                    goto basic_json_parser_5;
basic_json_parser_26:
                    ++m_cursor;
                    {
                        last_token_type = token_type::begin_object;
                        break;
                    }
basic_json_parser_28:
                    ++m_cursor;
                    {
                        last_token_type = token_type::end_object;
                        break;
                    }
basic_json_parser_30:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
basic_json_parser_31:
                    if (yybm[0 + yych] & 128)
                    {
                        goto basic_json_parser_30;
                    }
                    if (yych <= 0xE0)
                    {
                        if (yych <= '\\')
                        {
                            if (yych <= 0x1F)
                            {
                                goto basic_json_parser_32;
                            }
                            if (yych <= '"')
                            {
                                goto basic_json_parser_33;
                            }
                            goto basic_json_parser_35;
                        }
                        else
                        {
                            if (yych <= 0xC1)
                            {
                                goto basic_json_parser_32;
                            }
                            if (yych <= 0xDF)
                            {
                                goto basic_json_parser_36;
                            }
                            goto basic_json_parser_37;
                        }
                    }
                    else
                    {
                        if (yych <= 0xEF)
                        {
                            if (yych == 0xED)
                            {
                                goto basic_json_parser_39;
                            }
                            goto basic_json_parser_38;
                        }
                        else
                        {
                            if (yych <= 0xF0)
                            {
                                goto basic_json_parser_40;
                            }
                            if (yych <= 0xF3)
                            {
                                goto basic_json_parser_41;
                            }
                            if (yych <= 0xF4)
                            {
                                goto basic_json_parser_42;
                            }
                        }
                    }
basic_json_parser_32:
                    m_cursor = m_marker;
                    if (yyaccept == 0)
                    {
                        goto basic_json_parser_5;
                    }
                    else
                    {
                        goto basic_json_parser_14;
                    }
basic_json_parser_33:
                    ++m_cursor;
                    {
                        last_token_type = token_type::value_string;
                        break;
                    }
basic_json_parser_35:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 'e')
                    {
                        if (yych <= '/')
                        {
                            if (yych == '"')
                            {
                                goto basic_json_parser_30;
                            }
                            if (yych <= '.')
                            {
                                goto basic_json_parser_32;
                            }
                            goto basic_json_parser_30;
                        }
                        else
                        {
                            if (yych <= '\\')
                            {
                                if (yych <= '[')
                                {
                                    goto basic_json_parser_32;
                                }
                                goto basic_json_parser_30;
                            }
                            else
                            {
                                if (yych == 'b')
                                {
                                    goto basic_json_parser_30;
                                }
                                goto basic_json_parser_32;
                            }
                        }
                    }
                    else
                    {
                        if (yych <= 'q')
                        {
                            if (yych <= 'f')
                            {
                                goto basic_json_parser_30;
                            }
                            if (yych == 'n')
                            {
                                goto basic_json_parser_30;
                            }
                            goto basic_json_parser_32;
                        }
                        else
                        {
                            if (yych <= 's')
                            {
                                if (yych <= 'r')
                                {
                                    goto basic_json_parser_30;
                                }
                                goto basic_json_parser_32;
                            }
                            else
                            {
                                if (yych <= 't')
                                {
                                    goto basic_json_parser_30;
                                }
                                if (yych <= 'u')
                                {
                                    goto basic_json_parser_48;
                                }
                                goto basic_json_parser_32;
                            }
                        }
                    }
basic_json_parser_36:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 0x7F)
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych <= 0xBF)
                    {
                        goto basic_json_parser_30;
                    }
                    goto basic_json_parser_32;
basic_json_parser_37:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 0x9F)
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych <= 0xBF)
                    {
                        goto basic_json_parser_36;
                    }
                    goto basic_json_parser_32;
basic_json_parser_38:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 0x7F)
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych <= 0xBF)
                    {
                        goto basic_json_parser_36;
                    }
                    goto basic_json_parser_32;
basic_json_parser_39:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 0x7F)
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych <= 0x9F)
                    {
                        goto basic_json_parser_36;
                    }
                    goto basic_json_parser_32;
basic_json_parser_40:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 0x8F)
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych <= 0xBF)
                    {
                        goto basic_json_parser_38;
                    }
                    goto basic_json_parser_32;
basic_json_parser_41:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 0x7F)
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych <= 0xBF)
                    {
                        goto basic_json_parser_38;
                    }
                    goto basic_json_parser_32;
basic_json_parser_42:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 0x7F)
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych <= 0x8F)
                    {
                        goto basic_json_parser_38;
                    }
                    goto basic_json_parser_32;
basic_json_parser_43:
                    yych = *++m_cursor;
                    if (yych <= '/')
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych <= '9')
                    {
                        goto basic_json_parser_49;
                    }
                    goto basic_json_parser_32;
basic_json_parser_44:
                    yych = *++m_cursor;
                    if (yych <= ',')
                    {
                        if (yych == '+')
                        {
                            goto basic_json_parser_51;
                        }
                        goto basic_json_parser_32;
                    }
                    else
                    {
                        if (yych <= '-')
                        {
                            goto basic_json_parser_51;
                        }
                        if (yych <= '/')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= '9')
                        {
                            goto basic_json_parser_52;
                        }
                        goto basic_json_parser_32;
                    }
basic_json_parser_45:
                    yych = *++m_cursor;
                    if (yych == 'l')
                    {
                        goto basic_json_parser_54;
                    }
                    goto basic_json_parser_32;
basic_json_parser_46:
                    yych = *++m_cursor;
                    if (yych == 'l')
                    {
                        goto basic_json_parser_55;
                    }
                    goto basic_json_parser_32;
basic_json_parser_47:
                    yych = *++m_cursor;
                    if (yych == 'u')
                    {
                        goto basic_json_parser_56;
                    }
                    goto basic_json_parser_32;
basic_json_parser_48:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= '@')
                    {
                        if (yych <= '/')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= '9')
                        {
                            goto basic_json_parser_57;
                        }
                        goto basic_json_parser_32;
                    }
                    else
                    {
                        if (yych <= 'F')
                        {
                            goto basic_json_parser_57;
                        }
                        if (yych <= '`')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= 'f')
                        {
                            goto basic_json_parser_57;
                        }
                        goto basic_json_parser_32;
                    }
basic_json_parser_49:
                    yyaccept = 1;
                    m_marker = ++m_cursor;
                    if ((m_limit - m_cursor) < 3)
                    {
                        fill_line_buffer(3);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 'D')
                    {
                        if (yych <= '/')
                        {
                            goto basic_json_parser_14;
                        }
                        if (yych <= '9')
                        {
                            goto basic_json_parser_49;
                        }
                        goto basic_json_parser_14;
                    }
                    else
                    {
                        if (yych <= 'E')
                        {
                            goto basic_json_parser_44;
                        }
                        if (yych == 'e')
                        {
                            goto basic_json_parser_44;
                        }
                        goto basic_json_parser_14;
                    }
basic_json_parser_51:
                    yych = *++m_cursor;
                    if (yych <= '/')
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych >= ':')
                    {
                        goto basic_json_parser_32;
                    }
basic_json_parser_52:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= '/')
                    {
                        goto basic_json_parser_14;
                    }
                    if (yych <= '9')
                    {
                        goto basic_json_parser_52;
                    }
                    goto basic_json_parser_14;
basic_json_parser_54:
                    yych = *++m_cursor;
                    if (yych == 's')
                    {
                        goto basic_json_parser_58;
                    }
                    goto basic_json_parser_32;
basic_json_parser_55:
                    yych = *++m_cursor;
                    if (yych == 'l')
                    {
                        goto basic_json_parser_59;
                    }
                    goto basic_json_parser_32;
basic_json_parser_56:
                    yych = *++m_cursor;
                    if (yych == 'e')
                    {
                        goto basic_json_parser_61;
                    }
                    goto basic_json_parser_32;
basic_json_parser_57:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= '@')
                    {
                        if (yych <= '/')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= '9')
                        {
                            goto basic_json_parser_63;
                        }
                        goto basic_json_parser_32;
                    }
                    else
                    {
                        if (yych <= 'F')
                        {
                            goto basic_json_parser_63;
                        }
                        if (yych <= '`')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= 'f')
                        {
                            goto basic_json_parser_63;
                        }
                        goto basic_json_parser_32;
                    }
basic_json_parser_58:
                    yych = *++m_cursor;
                    if (yych == 'e')
                    {
                        goto basic_json_parser_64;
                    }
                    goto basic_json_parser_32;
basic_json_parser_59:
                    ++m_cursor;
                    {
                        last_token_type = token_type::literal_null;
                        break;
                    }
basic_json_parser_61:
                    ++m_cursor;
                    {
                        last_token_type = token_type::literal_true;
                        break;
                    }
basic_json_parser_63:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= '@')
                    {
                        if (yych <= '/')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= '9')
                        {
                            goto basic_json_parser_66;
                        }
                        goto basic_json_parser_32;
                    }
                    else
                    {
                        if (yych <= 'F')
                        {
                            goto basic_json_parser_66;
                        }
                        if (yych <= '`')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= 'f')
                        {
                            goto basic_json_parser_66;
                        }
                        goto basic_json_parser_32;
                    }
basic_json_parser_64:
                    ++m_cursor;
                    {
                        last_token_type = token_type::literal_false;
                        break;
                    }
basic_json_parser_66:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= '@')
                    {
                        if (yych <= '/')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= '9')
                        {
                            goto basic_json_parser_30;
                        }
                        goto basic_json_parser_32;
                    }
                    else
                    {
                        if (yych <= 'F')
                        {
                            goto basic_json_parser_30;
                        }
                        if (yych <= '`')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= 'f')
                        {
                            goto basic_json_parser_30;
                        }
                        goto basic_json_parser_32;
                    }
                }

            }

            return last_token_type;
        }